

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

LY_ERR lys_parse_path(ly_ctx *ctx,char *path,LYS_INFORMAT format,lys_module **module)

{
  LY_ERR LVar1;
  char *pcVar2;
  ly_in *in;
  ly_in *local_30;
  
  local_30 = (ly_in *)0x0;
  if (path == (char *)0x0) {
    pcVar2 = "path";
  }
  else {
    if (format != LYS_IN_UNKNOWN) {
      LVar1 = ly_in_new_filepath(path,0,&local_30);
      if (LVar1 != LY_SUCCESS) {
        ly_log(ctx,LY_LLERR,LVar1,"Unable to create input handler for filepath %s.",path);
        return LVar1;
      }
      LVar1 = lys_parse(ctx,local_30,format,(char **)0x0,module);
      ly_in_free(local_30,'\0');
      return LVar1;
    }
    pcVar2 = "format != LYS_IN_UNKNOWN";
  }
  ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar2,"lys_parse_path");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_parse_path(struct ly_ctx *ctx, const char *path, LYS_INFORMAT format, struct lys_module **module)
{
    LY_ERR ret;
    struct ly_in *in = NULL;

    LY_CHECK_ARG_RET(ctx, path, format != LYS_IN_UNKNOWN, LY_EINVAL);

    LY_CHECK_ERR_RET(ret = ly_in_new_filepath(path, 0, &in),
            LOGERR(ctx, ret, "Unable to create input handler for filepath %s.", path), ret);

    ret = lys_parse(ctx, in, format, NULL, module);
    ly_in_free(in, 0);

    return ret;
}